

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall xray_re::xr_ogf_v4::load_s_lods(xr_ogf_v4 *this,xr_reader *r)

{
  bool bVar1;
  size_t sVar2;
  xr_ogf_v4 *this_00;
  xr_ogf_v4 *local_30;
  xr_ogf *ogf;
  xr_reader *pxStack_20;
  uint32_t id;
  xr_reader *s;
  xr_reader *r_local;
  xr_ogf_v4 *this_local;
  
  s = r;
  r_local = (xr_reader *)this;
  sVar2 = xr_reader::size(r);
  if (sVar2 < 0x101) {
    xr_reader::r_sz(s,&(this->super_xr_ogf).super_xr_object.m_lod_ref);
  }
  else {
    bVar1 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::empty
                      (&(this->super_xr_ogf).m_lods);
    if (!bVar1) {
      __assert_fail("m_lods.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v4.cxx"
                    ,0x117,"void xray_re::xr_ogf_v4::load_s_lods(xr_reader &)");
    }
    ogf._4_4_ = 0;
    while( true ) {
      pxStack_20 = xr_reader::open_chunk(s,ogf._4_4_);
      if (pxStack_20 == (xr_reader *)0x0) break;
      this_00 = (xr_ogf_v4 *)operator_new(0x7b8);
      xr_ogf_v4(this_00);
      local_30 = this_00;
      std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::push_back
                (&(this->super_xr_ogf).m_lods,(value_type *)&local_30);
      (*(local_30->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory
        [0x15])(local_30,pxStack_20);
      xr_reader::close_chunk(s,&stack0xffffffffffffffe0);
      ogf._4_4_ = ogf._4_4_ + 1;
    }
    pxStack_20 = (xr_reader *)0x0;
  }
  xr_ogf::set_chunk_loaded(&this->super_xr_ogf,0x17);
  return;
}

Assistant:

void xr_ogf_v4::load_s_lods(xr_reader& r)
{
	// 2945 uses embedded LOD model while 3120, 3456+ reference external file.
	// try to distinguish by size.
	if (r.size() <= 0x100) {
		r.r_sz(m_lod_ref);
	} else {
		assert(m_lods.empty());
		xr_reader* s;
		for (uint32_t id = 0; (s = r.open_chunk(id)); ++id) {
			xr_ogf* ogf = new xr_ogf_v4;
			m_lods.push_back(ogf);
			ogf->load_ogf(*s);
			r.close_chunk(s);
		}
	}
	set_chunk_loaded(OGF4_S_LODS);
}